

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O1

Vector3d * __thiscall
OpenMD::StuntDouble::lab2Body(Vector3d *__return_storage_ptr__,StuntDouble *this,Vector3d *v)

{
  double dVar1;
  uint i;
  long lVar2;
  uint j;
  long lVar3;
  double (*__return_storage_ptr___00) [3];
  Vector<double,_3U> result;
  double local_78 [12];
  
  __return_storage_ptr___00 = (double (*) [3])(local_78 + 3);
  getA((RotMat3x3d *)__return_storage_ptr___00,this);
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  local_78[2] = 0.0;
  lVar2 = 0;
  do {
    dVar1 = local_78[lVar2];
    lVar3 = 0;
    do {
      dVar1 = dVar1 + (((SquareMatrix<double,_3> *)*__return_storage_ptr___00)->
                      super_RectMatrix<double,_3U,_3U>).data_[0][lVar3] *
                      (v->super_Vector<double,_3U>).data_[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_78[lVar2] = dVar1;
    lVar2 = lVar2 + 1;
    __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
  } while (lVar2 != 3);
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = local_78[2];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = local_78[0];
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = local_78[1];
  return __return_storage_ptr__;
}

Assistant:

Vector3d lab2Body(const Vector3d& v) { return getA() * v; }